

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O1

void __thiscall
cmFindProgramHelper::cmFindProgramHelper
          (cmFindProgramHelper *this,string *debugName,cmMakefile *makefile,cmFindBase *base)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PolicyStatus PVar2;
  string local_50;
  
  (this->Extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->BestPath)._M_dataplus._M_p = (pointer)&(this->BestPath).field_2;
  (this->BestPath)._M_string_length = 0;
  (this->BestPath).field_2._M_local_buf[0] = '\0';
  (this->Names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->TestNameExt)._M_dataplus._M_p = (pointer)&(this->TestNameExt).field_2;
  (this->TestNameExt)._M_string_length = 0;
  (this->TestNameExt).field_2._M_local_buf[0] = '\0';
  (this->TestPath)._M_dataplus._M_p = (pointer)&(this->TestPath).field_2;
  (this->TestPath)._M_string_length = 0;
  (this->TestPath).field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (debugName->_M_dataplus)._M_p;
  paVar1 = &debugName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar1) {
    local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&debugName->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_50._M_string_length = debugName->_M_string_length;
  (debugName->_M_dataplus)._M_p = (pointer)paVar1;
  debugName->_M_string_length = 0;
  (debugName->field_2)._M_local_buf[0] = '\0';
  cmFindBaseDebugState::cmFindBaseDebugState(&this->DebugSearches,&local_50,base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this->Makefile = makefile;
  this->FindBase = base;
  PVar2 = cmMakefile::GetPolicyStatus(makefile,CMP0109,false);
  this->PolicyCMP0109 = PVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<>(&this->Extensions);
  return;
}

Assistant:

cmFindProgramHelper(std::string debugName, cmMakefile* makefile,
                      cmFindBase const* base)
    : DebugSearches(std::move(debugName), base)
    , Makefile(makefile)
    , FindBase(base)
    , PolicyCMP0109(makefile->GetPolicyStatus(cmPolicies::CMP0109))
  {
#if defined(_WIN32) || defined(__CYGWIN__) || defined(__MINGW32__)
    // Consider platform-specific extensions.
    this->Extensions.push_back(".com");
    this->Extensions.push_back(".exe");
#endif
    // Consider original name with no extensions.
    this->Extensions.emplace_back();
  }